

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Derive.cpp
# Opt level: O0

bool __thiscall amrex::DeriveList::canDerive(DeriveList *this,string *name)

{
  bool bVar1;
  __type _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  const_iterator End;
  const_iterator li;
  list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_> *in_stack_ffffffffffffffc8;
  _Self local_28;
  _Self local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  
  __lhs = in_RDI;
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_>::begin
                 (in_stack_ffffffffffffffc8);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_>::end
                 (in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) {
      return false;
    }
    std::_List_const_iterator<amrex::DeriveRec>::operator->
              ((_List_const_iterator<amrex::DeriveRec> *)in_RDI);
    _Var2 = std::operator==(__lhs,in_RSI);
    if (_Var2) break;
    std::_List_const_iterator<amrex::DeriveRec>::operator++(&local_20);
  }
  return true;
}

Assistant:

bool
DeriveList::canDerive (const std::string& name) const
{
    for (std::list<DeriveRec>::const_iterator li = lst.begin(), End = lst.end();
         li != End;
         ++li)
    {
        if (li->derive_name == name)
            return true;
    }
    return false;
}